

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O3

String * __thiscall
kj::encodeBase64(String *__return_storage_ptr__,kj *this,ArrayPtr<const_unsigned_char> input,
                bool breakLines)

{
  kj kVar1;
  undefined1 auVar2 [16];
  int iVar3;
  char *pcVar4;
  int iVar5;
  char *pcVar6;
  long lVar7;
  size_t sVar8;
  kj *pkVar9;
  ulong uVar10;
  char *pcVar11;
  size_t total;
  Fault f;
  size_t local_28;
  
  auVar2._8_8_ = 0;
  auVar2._0_8_ = input.ptr + 2;
  sVar8 = SUB168(auVar2 * ZEXT816(0xaaaaaaaaaaaaaaab),8) * 2 & 0xfffffffffffffffc;
  if ((int)input.size_ != 0) {
    sVar8 = sVar8 + ((uint)(0x38e38e38e38e38e <
                           (sVar8 * -0x71c71c71c71c71c7 >> 3 | sVar8 * -0x71c71c71c71c71c7 << 0x3d))
                    + (int)(sVar8 / 0x48));
  }
  heapString(__return_storage_ptr__,sVar8);
  pcVar4 = (char *)(__return_storage_ptr__->content).size_;
  if (pcVar4 != (char *)0x0) {
    pcVar4 = (__return_storage_ptr__->content).ptr;
  }
  iVar3 = (int)pcVar4;
  pcVar6 = pcVar4;
  if (((undefined1  [16])input & (undefined1  [16])0xffffffff) == (undefined1  [16])0x0) {
    iVar5 = 0;
  }
  else {
    pkVar9 = this + (int)input.ptr;
    iVar5 = 0;
    do {
      kVar1 = *this;
      *pcVar6 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[(byte)kVar1 >> 2]
      ;
      uVar10 = (ulong)(((byte)kVar1 & 3) << 4);
      if (this + 1 == pkVar9) {
        total = (size_t)(((int)pcVar6 + 1) - iVar3);
        pcVar6 = pcVar4 + total;
        pcVar11 = pcVar6 + 2;
        *pcVar6 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[uVar10];
        pcVar6[1] = '=';
        lVar7 = 3;
LAB_001c2564:
        pcVar4 = pcVar4 + total;
        pcVar6 = pcVar4 + lVar7;
        *pcVar11 = '=';
        iVar5 = iVar5 + 1;
        goto LAB_001c256d;
      }
      kVar1 = this[1];
      pcVar6[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                  [(byte)kVar1 >> 4 | uVar10];
      uVar10 = (ulong)(((byte)kVar1 & 0xf) << 2);
      if (this + 2 == pkVar9) {
        total = (size_t)(((int)pcVar6 + 2) - iVar3);
        pcVar11 = pcVar4 + total + 1;
        pcVar4[total] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[uVar10];
        lVar7 = 2;
        goto LAB_001c2564;
      }
      kVar1 = this[2];
      pcVar6[2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                  [(byte)kVar1 >> 6 | uVar10];
      pcVar6[3] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                  [(byte)kVar1 & 0x3f];
      iVar5 = iVar5 + 1;
      if ((iVar5 == 0x12 & (byte)input.size_) == 1) {
        pcVar6[4] = '\n';
        pcVar6 = pcVar6 + 5;
        iVar5 = 0;
      }
      else {
        pcVar6 = pcVar6 + 4;
      }
      this = this + 3;
    } while (this != pkVar9);
  }
  total = (size_t)((int)pcVar6 - iVar3);
  pcVar4 = pcVar4 + total;
  pcVar6 = pcVar4;
LAB_001c256d:
  if (((byte)input.size_ != 0) && (0 < iVar5)) {
    *pcVar6 = '\n';
    pcVar6 = pcVar6 + 1;
  }
  total = (long)((int)pcVar6 - (int)pcVar4) + total;
  sVar8 = (__return_storage_ptr__->content).size_;
  local_28 = 0;
  if (sVar8 != 0) {
    local_28 = sVar8 - 1;
  }
  if (total != local_28) {
    _::Debug::Fault::Fault<kj::Exception::Type,unsigned_long&,unsigned_long>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/encoding.c++"
               ,0x349,FAILED,"total == output.size()","total, output.size()",&total,&local_28);
    _::Debug::Fault::fatal(&f);
  }
  return __return_storage_ptr__;
}

Assistant:

String encodeBase64(ArrayPtr<const byte> input, bool breakLines) {
  /* set up a destination buffer large enough to hold the encoded data */
  // equivalent to ceil(input.size() / 3) * 4
  auto numChars = (input.size() + 2) / 3 * 4;
  if (breakLines) {
    // Add space for newline characters.
    uint lineCount = numChars / CHARS_PER_LINE;
    if (numChars % CHARS_PER_LINE > 0) {
      // Partial line.
      ++lineCount;
    }
    numChars = numChars + lineCount;
  }
  auto output = heapString(numChars);
  /* keep track of our encoded position */
  char* c = output.begin();
  /* store the number of bytes encoded by a single call */
  int cnt = 0;
  size_t total = 0;
  /* we need an encoder state */
  base64_encodestate s;

  /*---------- START ENCODING ----------*/
  /* initialise the encoder state */
  base64_init_encodestate(&s);
  /* gather data from the input and send it to the output */
  cnt = base64_encode_block((const char *)input.begin(), input.size(), c, &s, breakLines);
  c += cnt;
  total += cnt;

  /* since we have encoded the entire input string, we know that
     there is no more input data; finalise the encoding */
  cnt = base64_encode_blockend(c, &s, breakLines);
  c += cnt;
  total += cnt;
  /*---------- STOP ENCODING  ----------*/

  KJ_ASSERT(total == output.size(), total, output.size());

  return output;
}